

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS JlOutputJson(JlDataObject *DataObject,_Bool IndentedFormat,char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  JL_OUTPUT_FLAGS OutputFlags;
  JL_STATUS jlStatus;
  char **pJsonStringBuffer_local;
  _Bool IndentedFormat_local;
  JlDataObject *DataObject_local;
  
  OutputFlags = 0;
  if (IndentedFormat) {
    OutputFlags = 2;
  }
  JVar1 = JlOutputJsonEx(DataObject,OutputFlags,pJsonStringBuffer);
  return JVar1;
}

Assistant:

JL_STATUS
    JlOutputJson
    (
        JlDataObject const*     DataObject,
        bool                    IndentedFormat,
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    jlStatus = JlOutputJsonEx(
        DataObject,
        IndentedFormat ? JL_OUTPUT_FLAGS_INDENT : JL_OUTPUT_FLAGS_NONE,
        pJsonStringBuffer );

    return jlStatus;
}